

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O0

int __thiscall btSparseSdf<3>::RemoveReferences(btSparseSdf<3> *this,btCollisionShape *pcs)

{
  Cell *pCVar1;
  int iVar2;
  Cell **ppCVar3;
  btCollisionShape *in_RSI;
  btAlignedObjectArray<btSparseSdf<3>::Cell_*> *in_RDI;
  Cell *pn;
  Cell *pc;
  Cell *pp;
  Cell **root;
  int i;
  int refcount;
  Cell *local_30;
  Cell *local_28;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    iVar2 = btAlignedObjectArray<btSparseSdf<3>::Cell_*>::size(in_RDI);
    if (iVar2 <= local_18) break;
    ppCVar3 = btAlignedObjectArray<btSparseSdf<3>::Cell_*>::operator[](in_RDI,local_18);
    local_28 = (Cell *)0x0;
    local_30 = *ppCVar3;
    while (local_30 != (Cell *)0x0) {
      pCVar1 = local_30->next;
      if (local_30->pclient == in_RSI) {
        if (local_28 == (Cell *)0x0) {
          *ppCVar3 = pCVar1;
        }
        else {
          local_28->next = pCVar1;
        }
        if (local_30 != (Cell *)0x0) {
          ::operator_delete(local_30);
        }
        local_30 = local_28;
        local_14 = local_14 + 1;
      }
      local_28 = local_30;
      local_30 = pCVar1;
    }
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int						RemoveReferences(btCollisionShape* pcs)
	{
		int	refcount=0;
		for(int i=0;i<cells.size();++i)
		{
			Cell*&	root=cells[i];
			Cell*	pp=0;
			Cell*	pc=root;
			while(pc)
			{
				Cell*	pn=pc->next;
				if(pc->pclient==pcs)
				{
					if(pp) pp->next=pn; else root=pn;
					delete pc;pc=pp;++refcount;
				}
				pp=pc;pc=pn;
			}
		}
		return(refcount);
	}